

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.h
# Opt level: O1

type _q_interpolate<QPoint>(QPoint *f,QPoint *t,qreal progress)

{
  int iVar1;
  int iVar2;
  type tVar3;
  undefined4 in_EDX;
  uint uVar4;
  double dVar5;
  double dVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  Representation RVar9;
  Representation RVar10;
  
  RVar9 = (*f).xp;
  RVar10 = (*f).yp;
  dVar5 = progress * (double)((*t).xp.m_i - RVar9.m_i);
  dVar7 = progress * (double)((*t).yp.m_i - RVar10.m_i);
  auVar6._0_8_ = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
  auVar6._8_8_ = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
  auVar6 = minpd(_DAT_004e2610,auVar6);
  auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar6._8_8_);
  auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar6._0_8_);
  uVar4 = movmskpd(in_EDX,auVar8);
  iVar2 = (int)auVar6._0_8_;
  if ((uVar4 & 1) == 0) {
    iVar2 = -0x80000000;
  }
  iVar1 = (int)auVar6._8_8_;
  if ((uVar4 & 2) == 0) {
    iVar1 = -0x80000000;
  }
  tVar3.xp.m_i = iVar2 + RVar9.m_i;
  tVar3.yp.m_i = RVar10.m_i + iVar1;
  return tVar3;
}

Assistant:

constexpr inline QPoint operator-(const QPoint &p1, const QPoint &p2) noexcept
    { return QPoint(p1.xp - p2.xp, p1.yp - p2.yp); }